

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared.cpp
# Opt level: O2

string * upperCaseFirst(string *__return_storage_ptr__,string *input)

{
  char *pcVar1;
  int iVar2;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)input);
  pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
  iVar2 = toupper((int)*pcVar1);
  *pcVar1 = (char)iVar2;
  return __return_storage_ptr__;
}

Assistant:

std::string upperCaseFirst (const std::string& input)
{
  std::string output {input};
  output[0] = toupper (output[0]);
  return output;
}